

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O2

YSRESULT __thiscall YsSoundPlayer::SoundData::LoadWav(SoundData *this,BinaryInStream *inStream)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  uchar *puVar6;
  char *pcVar7;
  ulong uVar8;
  uchar buf [256];
  
  CleanUp(this);
  iVar3 = (**inStream->_vptr_BinaryInStream)(inStream,buf,4);
  if (CONCAT44(extraout_var,iVar3) == 4) {
    if (buf._0_4_ != 0x46464952) {
      puts("Warning: RIFF not found.");
    }
    iVar3 = (**inStream->_vptr_BinaryInStream)(inStream,buf,4);
    if (CONCAT44(extraout_var_00,iVar3) == 4) {
      printf("File Size=%d\n",(ulong)(buf._0_4_ + 8));
      iVar3 = (**inStream->_vptr_BinaryInStream)(inStream,buf,8);
      if (CONCAT44(extraout_var_01,iVar3) == 8) {
        iVar3 = bcmp(buf,"WAVEfmt",7);
        if (iVar3 != 0) {
          puts("Warning: WAVEfmt not found");
        }
        iVar3 = (**inStream->_vptr_BinaryInStream)(inStream,buf,4);
        uVar2 = buf._0_4_;
        if (CONCAT44(extraout_var_02,iVar3) == 4) {
          uVar8 = (ulong)(uint)buf._0_4_;
          printf("Header Size=%d\n",uVar8);
          iVar3 = (**inStream->_vptr_BinaryInStream)(inStream,buf,uVar8);
          if (CONCAT44(extraout_var_03,iVar3) == uVar8) {
            uVar1 = (uint)buf._0_4_ >> 0x10;
            uVar5 = 0;
            if ((uint)uVar2 < 0x10) {
              uVar4 = 0;
            }
            else {
              uVar4 = (uint)(ushort)buf._14_2_;
              uVar5 = 0;
              if (0x11 < (uint)uVar2) {
                uVar5 = (uint)(ushort)buf._16_2_;
              }
            }
            printf("wFormatTag=%d\n",(ulong)(ushort)buf._0_2_);
            printf("nChannels=%d\n",(ulong)uVar1);
            printf("nSamplesPerSec=%d\n",(ulong)(uint)buf._4_4_);
            printf("nAvgBytesPerSec=%d\n",(ulong)(uint)buf._8_4_);
            printf("nBlockAlign=%d\n",(ulong)(ushort)buf._12_2_);
            printf("wBitsPerSample=%d\n",(ulong)uVar4);
            printf("cbSize=%d\n",(ulong)uVar5);
            do {
              iVar3 = (**inStream->_vptr_BinaryInStream)(inStream,buf,4);
              if (CONCAT44(extraout_var_04,iVar3) != 4) {
                pcVar7 = "Error while waiting for data.";
                goto LAB_001123b4;
              }
              if ((((buf[1] & 0xdf) == 0x41 && (buf[0] & 0xdf) == 0x44) && ((buf[2] & 0xdf) == 0x54)
                  ) && ((buf[3] & 0xdf) == 0x41)) {
                iVar3 = (**inStream->_vptr_BinaryInStream)(inStream,buf,4);
                if (CONCAT44(extraout_var_07,iVar3) == 4) {
                  uVar8 = (ulong)(uint)buf._0_4_;
                  printf("Data Size=%d (0x%x)\n",uVar8,(ulong)(uint)buf._0_4_);
                  puVar6 = (uchar *)operator_new__(uVar8);
                  this->dat = puVar6;
                  uVar5 = (**inStream->_vptr_BinaryInStream)(inStream,puVar6,uVar8);
                  if (buf._0_4_ != uVar5) {
                    puts("Warning: File ended before reading all data.");
                    printf("  %d (0x%x) bytes have been read\n",(ulong)uVar5,(ulong)uVar5);
                  }
                  this->stereo = (uint)(uVar1 == 2);
                  this->bit = uVar4;
                  this->sizeInBytes = buf._0_4_;
                  this->rate = buf._4_4_;
                  if (uVar4 == 8) {
                    this->isSigned = YSFALSE;
                  }
                  else {
                    this->isSigned = YSTRUE;
                  }
                  return YSOK;
                }
                pcVar7 = "Error in reading data size.";
                goto LAB_001123b4;
              }
              printf("Skipping %c%c%c%c (Unknown Block)\n",(ulong)buf[0],(ulong)buf[1],(ulong)buf[2]
                     ,(ulong)buf[3]);
              iVar3 = (**inStream->_vptr_BinaryInStream)(inStream,buf,4);
            } while ((CONCAT44(extraout_var_05,iVar3) == 4) &&
                    (uVar8 = (ulong)(uint)buf._0_4_,
                    iVar3 = (*inStream->_vptr_BinaryInStream[1])(inStream,uVar8),
                    CONCAT44(extraout_var_06,iVar3) == uVar8));
            pcVar7 = "Error while skipping unknown block.";
            goto LAB_001123b4;
          }
          pcVar7 = "Error in reading header.";
        }
        else {
          pcVar7 = "Error in reading header size.";
        }
      }
      else {
        pcVar7 = "Error in reading WAVEfmt.";
      }
      puts(pcVar7);
      return YSERR;
    }
    pcVar7 = "Error in reading file size.";
  }
  else {
    pcVar7 = "Error in reading RIFF.";
  }
LAB_001123b4:
  puts(pcVar7);
  return YSERR;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::LoadWav(BinaryInStream &inStream)
{
	CleanUp();

	unsigned char buf[256];
	unsigned int l;
	unsigned int fSize,hdrSize,dataSize;

	// Wave Header
	unsigned short wFormatTag,nChannels;
	unsigned nSamplesPerSec,nAvgBytesPerSec;
	unsigned short nBlockAlign,wBitsPerSample,cbSize;


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading RIFF.\n");
		return YSERR;
	}
	if(strncmp((char *)buf,"RIFF",4)!=0)
	{
		printf("Warning: RIFF not found.\n");
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading file size.\n");
		return YSERR;
	}
	fSize=GetUnsigned(buf);
	printf("File Size=%d\n",fSize+8);
	// Wait, is it fSize+12?  A new theory tells that "fmt " immediately following "WAVE"
	// is a chunk???

	if(inStream.Fetch(buf,8)!=8)
	{
		printf("Error in reading WAVEfmt.\n");
		return YSERR;
	}
	if(strncmp((char *)buf,"WAVEfmt",7)!=0)
	{
		printf("Warning: WAVEfmt not found\n");
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading header size.\n");
		return YSERR;
	}
	hdrSize=GetUnsigned(buf);
	printf("Header Size=%d\n",hdrSize);


	//    WORD  wFormatTag; 
	//    WORD  nChannels; 
	//    DWORD nSamplesPerSec; 
	//    DWORD nAvgBytesPerSec; 
	//    WORD  nBlockAlign; 
	//    WORD  wBitsPerSample; 
	//    WORD  cbSize; 
	if(inStream.Fetch(buf,hdrSize)!=hdrSize)
	{
		printf("Error in reading header.\n");
		return YSERR;
	}
	wFormatTag=GetUnsignedShort(buf);
	nChannels=GetUnsignedShort(buf+2);
	nSamplesPerSec=GetUnsigned(buf+4);
	nAvgBytesPerSec=GetUnsigned(buf+8);
	nBlockAlign=GetUnsignedShort(buf+12);
	wBitsPerSample=(hdrSize>=16 ? GetUnsignedShort(buf+14) : 0);
	cbSize=(hdrSize>=18 ? GetUnsignedShort(buf+16) : 0);

	printf("wFormatTag=%d\n",wFormatTag);
	printf("nChannels=%d\n",nChannels);
	printf("nSamplesPerSec=%d\n",nSamplesPerSec);
	printf("nAvgBytesPerSec=%d\n",nAvgBytesPerSec);
	printf("nBlockAlign=%d\n",nBlockAlign);
	printf("wBitsPerSample=%d\n",wBitsPerSample);
	printf("cbSize=%d\n",cbSize);



	for(;;)
	{
		if(inStream.Fetch(buf,4)!=4)
		{
			printf("Error while waiting for data.\n");
			return YSERR;
		}

		if((buf[0]=='d' || buf[0]=='D') && (buf[1]=='a' || buf[1]=='A') &&
		   (buf[2]=='t' || buf[2]=='T') && (buf[3]=='a' || buf[3]=='A'))
		{
			break;
		}
		else
		{
			printf("Skipping %c%c%c%c (Unknown Block)\n",buf[0],buf[1],buf[2],buf[3]);
			if(inStream.Fetch(buf,4)!=4)
			{
				printf("Error while skipping unknown block.\n");
				return YSERR;
			}



			l=GetUnsigned(buf);
			if(inStream.Skip(l)!=l)
			{
				printf("Error while skipping unknown block.\n");
				return YSERR;
			}
		}
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading data size.\n");
		return YSERR;
	}
	dataSize=GetUnsigned(buf);
	printf("Data Size=%d (0x%x)\n",dataSize,dataSize);

	dat=new unsigned char [dataSize];
	if((l=inStream.Fetch(dat,dataSize))!=dataSize)
	{
		printf("Warning: File ended before reading all data.\n");
		printf("  %d (0x%x) bytes have been read\n",l,l);
	}

	this->stereo=(nChannels==2 ? YSTRUE : YSFALSE);
	this->bit=wBitsPerSample;
	this->sizeInBytes=dataSize;
	this->rate=nSamplesPerSec;

	if(wBitsPerSample==8)
	{
		isSigned=YSFALSE;
	}
	else
	{
		isSigned=YSTRUE;
	}

	return YSOK;
}